

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O1

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalReset::Deserialize(LogicalReset *this,Deserializer *deserializer)

{
  undefined8 uVar1;
  SetScope SVar2;
  int iVar3;
  LogicalOperator *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  string str;
  _func_int **local_88;
  pointer local_78;
  pointer puStack_70;
  _func_int **local_68;
  undefined8 local_60;
  undefined1 local_58;
  undefined7 uStack_57;
  undefined1 uStack_50;
  undefined4 uStack_4f;
  undefined2 uStack_4b;
  undefined1 uStack_49;
  char *local_48 [2];
  char local_38 [9];
  undefined4 local_2f;
  undefined2 local_2b;
  undefined1 local_29;
  
  iVar3 = (*deserializer->_vptr_Deserializer[4])(deserializer,200,"name");
  if ((char)iVar3 == '\0') {
    (*deserializer->_vptr_Deserializer[5])(deserializer,0);
    local_38[0] = '\0';
    local_68 = (_func_int **)&local_58;
    local_58 = 0;
    uStack_57 = (undefined7)local_38._1_8_;
    uStack_50 = SUB81(local_38._1_8_,7);
    uStack_4f = local_2f;
    uStack_4b = local_2b;
    uStack_49 = local_29;
    local_60 = 0;
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(&local_68,deserializer);
    (*deserializer->_vptr_Deserializer[5])(deserializer,1);
  }
  (*deserializer->_vptr_Deserializer[2])(deserializer,0xc9,"scope");
  if (deserializer->deserialize_enum_from_string == true) {
    (*deserializer->_vptr_Deserializer[0x1a])(local_48,deserializer);
    SVar2 = EnumUtil::FromString<duckdb::SetScope>(local_48[0]);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xf])(deserializer);
    SVar2 = (SetScope)iVar3;
  }
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (LogicalOperator *)operator_new(0x90);
  uVar1 = local_60;
  if (local_68 == (_func_int **)&local_58) {
    puStack_70 = (pointer)CONCAT17(uStack_49,CONCAT25(uStack_4b,CONCAT41(uStack_4f,uStack_50)));
    local_88 = (_func_int **)&local_78;
  }
  else {
    local_88 = local_68;
  }
  local_78 = (pointer)CONCAT71(uStack_57,local_58);
  local_60 = 0;
  local_58 = 0;
  local_68 = (_func_int **)&local_58;
  LogicalOperator::LogicalOperator(this_00,LOGICAL_RESET);
  this_00->_vptr_LogicalOperator = (_func_int **)&PTR__LogicalReset_019a70d8;
  this_00[1]._vptr_LogicalOperator = (_func_int **)&this_00[1].children;
  if ((pointer *)local_88 == &local_78) {
    this_00[1].children.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_78;
    this_00[1].children.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = puStack_70;
  }
  else {
    this_00[1]._vptr_LogicalOperator = local_88;
    this_00[1].children.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_start = local_78;
  }
  *(undefined8 *)&this_00[1].type = uVar1;
  local_78 = (pointer)((ulong)local_78 & 0xffffffffffffff00);
  *(SetScope *)
   &this_00[1].children.
    super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    .
    super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = SVar2;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  if (local_68 != (_func_int **)&local_58) {
    operator_delete(local_68);
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalReset::Deserialize(Deserializer &deserializer) {
	auto name = deserializer.ReadPropertyWithDefault<string>(200, "name");
	auto scope = deserializer.ReadProperty<SetScope>(201, "scope");
	auto result = duckdb::unique_ptr<LogicalReset>(new LogicalReset(std::move(name), scope));
	return std::move(result);
}